

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::Extern::MatchImpl<wabt::interp::EventType>
          (Extern *this,Store *store,ImportType *import_type,EventType *actual,Ptr *out_trap)

{
  ExternType *pEVar1;
  Enum EVar2;
  char *pcVar3;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_88;
  RefPtr<wabt::interp::Trap> local_68 [2];
  
  pEVar1 = (import_type->type)._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  if ((pEVar1 == (ExternType *)0x0) || (pEVar1->kind != Event)) {
    if ((long)(int)pEVar1->kind < 5) {
      pcVar3 = (char *)(&g_kind_name)[(int)pEVar1->kind];
    }
    else {
      pcVar3 = "<error_kind>";
    }
    StringPrintf_abi_cxx11_
              (&local_a8,"expected import \"%s.%s\" to have kind %s, not %s",
               (import_type->module)._M_dataplus._M_p,(import_type->name)._M_dataplus._M_p,pcVar3,
               PTR_anon_var_dwarf_32142_001a52a0);
    local_88.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (local_68,store,store,&local_a8,&local_88);
    out_trap->obj_ = local_68[0].obj_;
    out_trap->store_ = local_68[0].store_;
    out_trap->root_index_ = local_68[0].root_index_;
    local_68[0].root_index_ = 0;
    local_68[0].obj_ = (Trap *)0x0;
    local_68[0].store_ = (Store *)0x0;
    if (local_88.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    EVar2 = Error;
  }
  else {
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result Extern::MatchImpl(Store& store,
                         const ImportType& import_type,
                         const T& actual,
                         Trap::Ptr* out_trap) {
  const T* extern_type = dyn_cast<T>(import_type.type.get());
  if (!extern_type) {
    *out_trap = Trap::New(
        store,
        StringPrintf("expected import \"%s.%s\" to have kind %s, not %s",
                     import_type.module.c_str(), import_type.name.c_str(),
                     GetName(import_type.type->kind), GetName(T::skind)));
    return Result::Error;
  }

  std::string msg;
  if (Failed(interp::Match(*extern_type, actual, &msg))) {
    *out_trap = Trap::New(store, msg);
    return Result::Error;
  }

  return Result::Ok;
}